

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::Tokenizer
          (Tokenizer *this,Options *options,shared_ptr<const_onmt::SubwordEncoder> *subword_encoder)

{
  Options *in_RSI;
  Tokenizer *in_RDI;
  Options *in_stack_00000090;
  
  ITokenizer::ITokenizer(&in_RDI->super_ITokenizer);
  (in_RDI->super_ITokenizer)._vptr_ITokenizer = (_func_int **)&PTR__Tokenizer_006efd98;
  Options::Options((Options *)in_RDI,in_RSI);
  std::shared_ptr<const_onmt::SubwordEncoder>::shared_ptr
            ((shared_ptr<const_onmt::SubwordEncoder> *)0x3c1c21);
  Options::validate(in_stack_00000090);
  set_subword_encoder(in_RDI,(shared_ptr<const_onmt::SubwordEncoder> *)in_RSI);
  return;
}

Assistant:

Tokenizer::Tokenizer(Options options,
                       const std::shared_ptr<const SubwordEncoder>& subword_encoder)
    : _options(std::move(options))
  {
    _options.validate();
    set_subword_encoder(subword_encoder);
  }